

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysc_must_free(lysf_ctx *ctx,lysc_must *must)

{
  lysc_ext_instance *plVar1;
  void *pvVar2;
  long lVar3;
  
  if (must != (lysc_must *)0x0) {
    lyxp_expr_free(ctx->ctx,must->cond);
    ly_free_prefix_data(LY_VALUE_SCHEMA_RESOLVED,must->prefixes);
    lydict_remove(ctx->ctx,must->emsg);
    lydict_remove(ctx->ctx,must->eapptag);
    lydict_remove(ctx->ctx,must->dsc);
    lydict_remove(ctx->ctx,must->ref);
    lVar3 = 0;
    pvVar2 = (void *)0x0;
    while (plVar1 = must->exts, plVar1 != (lysc_ext_instance *)0x0) {
      if (plVar1[-1].compiled <= pvVar2) {
        free(&plVar1[-1].compiled);
        return;
      }
      lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar1->def + lVar3));
      pvVar2 = (void *)((long)pvVar2 + 1);
      lVar3 = lVar3 + 0x48;
    }
  }
  return;
}

Assistant:

static void
lysc_must_free(struct lysf_ctx *ctx, struct lysc_must *must)
{
    if (!must) {
        return;
    }

    lyxp_expr_free(ctx->ctx, must->cond);
    ly_free_prefix_data(LY_VALUE_SCHEMA_RESOLVED, must->prefixes);
    lydict_remove(ctx->ctx, must->emsg);
    lydict_remove(ctx->ctx, must->eapptag);
    lydict_remove(ctx->ctx, must->dsc);
    lydict_remove(ctx->ctx, must->ref);
    FREE_ARRAY(ctx, must->exts, lysc_ext_instance_free);
}